

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  KINMem kin_mem_00;
  N_Vector Q;
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  KINMem in_RDI;
  N_Vector in_R8;
  long in_R9;
  double dVar3;
  sunrealtype *in_stack_00000008;
  sunrealtype *in_stack_00000010;
  long i_3;
  long j_1;
  long i_2;
  long i_1;
  int j;
  N_Vector tmp_df_1;
  N_Vector tmp_dg_1;
  long new_depth;
  long i;
  N_Vector tmp_df;
  N_Vector tmp_dg;
  N_Vector *Xv;
  sunrealtype *cv;
  int nvec;
  sunrealtype onembeta;
  sunrealtype alfa;
  long lAA;
  int retval;
  long local_f8;
  long local_f0;
  double local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined8 in_stack_ffffffffffffff38;
  long lVar4;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  N_Vector *in_stack_ffffffffffffff48;
  KINMem in_stack_ffffffffffffff50;
  long local_a8;
  long local_a0;
  N_Vector local_98;
  N_Vector local_90;
  N_Vector *local_88;
  sunrealtype *local_80;
  int local_74;
  double local_70;
  double local_68;
  ulong local_60;
  int local_54;
  long local_50;
  N_Vector local_48;
  undefined8 local_40;
  N_Vector local_38;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_74 = 0;
  local_80 = in_RDI->kin_cv;
  local_88 = in_RDI->kin_Xv;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,in_RSI,in_R8,in_RDX);
  if (0 < local_50) {
    if (in_RDI->kin_current_depth == in_RDI->kin_m_aa) {
      local_90 = *in_RDI->kin_dg_aa;
      local_98 = *in_RDI->kin_df_aa;
      for (local_a0 = 1; local_a0 < in_RDI->kin_m_aa; local_a0 = local_a0 + 1) {
        in_RDI->kin_dg_aa[local_a0 + -1] = in_RDI->kin_dg_aa[local_a0];
        in_RDI->kin_df_aa[local_a0 + -1] = in_RDI->kin_df_aa[local_a0];
      }
      in_RDI->kin_dg_aa[in_RDI->kin_m_aa + -1] = local_90;
      in_RDI->kin_df_aa[in_RDI->kin_m_aa + -1] = local_98;
      iVar1 = AndersonAccQRDelete(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                  (sunrealtype *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  iVar1);
      if (iVar1 != 0) {
        return iVar1;
      }
      in_RDI->kin_current_depth = in_RDI->kin_current_depth + -1;
      local_54 = 0;
    }
    N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,in_RSI,in_RDI->kin_gold_aa,
                 in_RDI->kin_dg_aa[in_RDI->kin_current_depth]);
    N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,local_38,in_RDI->kin_fold_aa,
                 in_RDI->kin_df_aa[in_RDI->kin_current_depth]);
    in_RDI->kin_current_depth = in_RDI->kin_current_depth + 1;
  }
  N_VScale(0x3ff0000000000000,in_RSI,in_RDI->kin_gold_aa);
  N_VScale(0x3ff0000000000000,local_38,in_RDI->kin_fold_aa);
  if (in_RDI->kin_current_depth == 0) {
    if ((in_RDI->kin_damping_aa == 0) && (in_RDI->kin_damping_fn == (KINDampingFn)0x0)) {
      N_VScale(0x3ff0000000000000,in_RSI,local_40);
    }
    else {
      if (in_RDI->kin_damping_fn != (KINDampingFn)0x0) {
        local_54 = (*in_RDI->kin_damping_fn)
                             (in_RDI->kin_nni,local_48,in_RSI,(sunrealtype *)0x0,0,
                              in_RDI->kin_user_data,&in_RDI->kin_beta_aa);
        if (local_54 != 0) {
          KINProcessError(in_RDI,-0x12,0xc37,"AndersonAcc",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"The damping function failed.");
          return -0x12;
        }
        if ((in_RDI->kin_beta_aa <= 0.0) || (1.0 < in_RDI->kin_beta_aa)) {
          KINProcessError(in_RDI,-0x12,0xc3d,"AndersonAcc",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"The damping parameter is outside of the range (0, 1].");
          return -0x12;
        }
        local_54 = 0;
      }
      N_VLinearSum(1.0 - in_RDI->kin_beta_aa,in_RDI->kin_beta_aa,local_48,in_RSI,local_40);
    }
    return 0;
  }
  if (in_RDI->kin_current_depth == 1) {
    dVar3 = (double)N_VDotProd(*in_RDI->kin_df_aa,*in_RDI->kin_df_aa);
    if (0.0 < dVar3) {
      dVar3 = (double)N_VDotProd(*in_RDI->kin_df_aa,*in_RDI->kin_df_aa);
      local_e8 = sqrt(dVar3);
    }
    else {
      local_e8 = 0.0;
    }
    *in_stack_00000008 = local_e8;
    local_68 = 1.0 / *in_stack_00000008;
    N_VScale(local_68,*in_RDI->kin_df_aa,*in_RDI->kin_q_aa);
  }
  else {
    (*in_RDI->kin_qr_func)
              (in_RDI->kin_q_aa,in_stack_00000008,in_RDI->kin_df_aa[in_RDI->kin_current_depth + -1],
               (int)in_RDI->kin_current_depth + -1,(int)in_RDI->kin_m_aa,in_RDI->kin_qr_data);
  }
  if (in_RDI->kin_depth_fn != (KINDepthFn)0x0) {
    local_a8 = in_RDI->kin_current_depth;
    local_54 = (*in_RDI->kin_depth_fn)
                         (in_RDI->kin_nni,local_48,in_RSI,local_38,in_RDI->kin_df_aa,
                          in_stack_00000008,in_RDI->kin_current_depth,in_RDI->kin_user_data,
                          &local_a8,(int *)0x0);
    if (local_54 != 0) {
      KINProcessError(in_RDI,-0x13,0xc6b,"AndersonAcc",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                      ,"The depth function failed.");
      return -0x13;
    }
    if (local_a8 < in_RDI->kin_current_depth) {
      local_f0 = local_a8;
    }
    else {
      local_f0 = in_RDI->kin_current_depth;
    }
    if (local_f0 < 1) {
      local_f8 = 0;
    }
    else {
      local_f8 = local_f0;
    }
    local_a8 = local_f8;
    if (local_f8 == 0) {
      in_RDI->kin_current_depth = 0;
      if ((in_RDI->kin_damping_aa == 0) && (in_RDI->kin_damping_fn == (KINDampingFn)0x0)) {
        N_VScale(0x3ff0000000000000,in_RSI,local_40);
      }
      else {
        if (in_RDI->kin_damping_fn != (KINDampingFn)0x0) {
          local_54 = (*in_RDI->kin_damping_fn)
                               (in_RDI->kin_nni,local_48,in_RSI,(sunrealtype *)0x0,0,
                                in_RDI->kin_user_data,&in_RDI->kin_beta_aa);
          if (local_54 != 0) {
            KINProcessError(in_RDI,-0x12,0xc81,"AndersonAcc",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The damping function failed.");
            return -0x12;
          }
          if ((in_RDI->kin_beta_aa <= 0.0) || (1.0 < in_RDI->kin_beta_aa)) {
            KINProcessError(in_RDI,-0x12,0xc87,"AndersonAcc",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The damping parameter is outside of the range (0, 1].");
            return -0x12;
          }
        }
        local_54 = 0;
        N_VLinearSum(1.0 - in_RDI->kin_beta_aa,in_RDI->kin_beta_aa,local_48,in_RSI,local_40);
      }
      return 0;
    }
    if (local_f8 < in_RDI->kin_current_depth) {
      for (iVar1 = 0; local_54 = 0, (long)iVar1 < in_RDI->kin_current_depth - local_a8;
          iVar1 = iVar1 + 1) {
        kin_mem_00 = (KINMem)*in_RDI->kin_dg_aa;
        Q = *in_RDI->kin_df_aa;
        for (lVar4 = 1; lVar4 < in_RDI->kin_current_depth; lVar4 = lVar4 + 1) {
          in_RDI->kin_dg_aa[lVar4 + -1] = in_RDI->kin_dg_aa[lVar4];
          in_RDI->kin_df_aa[lVar4 + -1] = in_RDI->kin_df_aa[lVar4];
        }
        in_RDI->kin_dg_aa[in_RDI->kin_current_depth + -1] = (N_Vector)kin_mem_00;
        in_RDI->kin_df_aa[in_RDI->kin_current_depth + -1] = Q;
        iVar2 = AndersonAccQRDelete(kin_mem_00,(N_Vector *)Q,
                                    (sunrealtype *)CONCAT44(iVar1,in_stack_ffffffffffffff40),
                                    (int)((ulong)lVar4 >> 0x20));
        if (iVar2 != 0) {
          return iVar2;
        }
        in_RDI->kin_current_depth = in_RDI->kin_current_depth + -1;
      }
    }
    local_54 = 0;
  }
  local_60 = in_RDI->kin_current_depth;
  local_54 = N_VDotProdMulti(local_60 & 0xffffffff,local_38,in_RDI->kin_q_aa,in_stack_00000010);
  if (local_54 != 0) {
    return -0x10;
  }
  if (in_RDI->kin_damping_fn != (KINDampingFn)0x0) {
    local_54 = (*in_RDI->kin_damping_fn)
                         (in_RDI->kin_nni,local_48,in_RSI,in_stack_00000010,local_60,
                          in_RDI->kin_user_data,&in_RDI->kin_beta_aa);
    if (local_54 != 0) {
      KINProcessError(in_RDI,-0x12,0xcc8,"AndersonAcc",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                      ,"The damping function failed.");
      return -0x12;
    }
    if ((in_RDI->kin_beta_aa <= 0.0) || (1.0 < in_RDI->kin_beta_aa)) {
      KINProcessError(in_RDI,-0x12,0xcce,"AndersonAcc",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                      ,"The damping parameter is outside of the range (0, 1].");
      return -0x12;
    }
  }
  local_54 = 0;
  *local_80 = 1.0;
  *local_88 = in_RSI;
  local_74 = 1;
  local_d8 = local_60;
  while (local_d0 = local_d8 - 1, -1 < (long)local_d0) {
    for (; (long)local_d8 < (long)local_60; local_d8 = local_d8 + 1) {
      in_stack_00000010[local_d0] =
           -in_stack_00000008[local_d8 * in_RDI->kin_m_aa + local_d0] * in_stack_00000010[local_d8]
           + in_stack_00000010[local_d0];
    }
    in_stack_00000010[local_d0] =
         in_stack_00000010[local_d0] / in_stack_00000008[local_d0 * in_RDI->kin_m_aa + local_d0];
    local_80[local_74] = -in_stack_00000010[local_d0];
    local_88[local_74] = in_RDI->kin_dg_aa[local_d0];
    local_74 = local_74 + 1;
    local_d8 = local_d0;
  }
  if ((in_RDI->kin_damping_aa != 0) || (in_RDI->kin_damping_fn != (KINDampingFn)0x0)) {
    local_70 = 1.0 - in_RDI->kin_beta_aa;
    local_80[local_74] = -local_70;
    local_88[local_74] = local_38;
    local_e0 = local_60;
    while( true ) {
      local_74 = local_74 + 1;
      local_e0 = local_e0 - 1;
      if ((long)local_e0 < 0) break;
      local_80[local_74] = local_70 * in_stack_00000010[local_e0];
      local_88[local_74] = in_RDI->kin_df_aa[local_e0];
    }
  }
  iVar1 = N_VLinearCombination(local_74,local_80,local_88,local_40);
  if (iVar1 != 0) {
    return -0x10;
  }
  return 0;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int lAA;
  sunrealtype alfa;
  sunrealtype onembeta;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* Compute residual F(x) = G(x_old) - x_old */
  N_VLinearSum(ONE, gval, -ONE, xold, fv);

  if (iter > 0)
  {
    /* If we've filled the acceleration subspace, start recycling */
    if (kin_mem->kin_current_depth == kin_mem->kin_m_aa)
    {
      /* Move the left-most column vector (oldest value) to the end so it gets
         overwritten with the newest value below. */
      N_Vector tmp_dg = kin_mem->kin_dg_aa[0];
      N_Vector tmp_df = kin_mem->kin_df_aa[0];
      for (long int i = 1; i < kin_mem->kin_m_aa; i++)
      {
        kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
        kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
      }
      kin_mem->kin_dg_aa[kin_mem->kin_m_aa - 1] = tmp_dg;
      kin_mem->kin_df_aa[kin_mem->kin_m_aa - 1] = tmp_df;

      /* Delete left-most column vector from QR factorization */
      retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                   (int)kin_mem->kin_m_aa);
      if (retval) { return retval; }

      kin_mem->kin_current_depth--;
    }

    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[kin_mem->kin_current_depth]);

    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[kin_mem->kin_current_depth]);

    kin_mem->kin_current_depth++;
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (kin_mem->kin_current_depth == 0)
  {
    if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
    {
      if (kin_mem->kin_damping_fn)
      {
        retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL, 0,
                                         kin_mem->kin_user_data,
                                         &(kin_mem->kin_beta_aa));
        if (retval)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping function failed.");
          return KIN_DAMPING_FN_ERR;
        }
        if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping parameter is outside of the range (0, 1].");
          return KIN_DAMPING_FN_ERR;
        }
      }

      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                   gval, x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }

    return KIN_SUCCESS;
  }

  /* Add a column to the QR factorization */

  if (kin_mem->kin_current_depth == 1)
  {
    R[0] = SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[0], kin_mem->kin_df_aa[0]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[0], kin_mem->kin_q_aa[0]);
  }
  else
  {
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R,
                         kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1],
                         (int)kin_mem->kin_current_depth - 1,
                         (int)kin_mem->kin_m_aa, (void*)kin_mem->kin_qr_data);
  }

  /* Adjust the depth */
  if (kin_mem->kin_depth_fn)
  {
    long int new_depth = kin_mem->kin_current_depth;

    retval = kin_mem->kin_depth_fn(kin_mem->kin_nni, xold, gval, fv,
                                   kin_mem->kin_df_aa, R,
                                   kin_mem->kin_current_depth,
                                   kin_mem->kin_user_data, &new_depth, NULL);
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DEPTH_FN_ERR, __LINE__, __func__, __FILE__,
                      "The depth function failed.");
      return KIN_DEPTH_FN_ERR;
    }

    new_depth = SUNMIN(new_depth, kin_mem->kin_current_depth);
    new_depth = SUNMAX(new_depth, 0);

    if (new_depth == 0)
    {
      kin_mem->kin_current_depth = new_depth;

      /* do fixed point update */
      if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
      {
        if (kin_mem->kin_damping_fn)
        {
          retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL,
                                           0, kin_mem->kin_user_data,
                                           &(kin_mem->kin_beta_aa));
          if (retval)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping function failed.");
            return KIN_DAMPING_FN_ERR;
          }
          if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping parameter is outside of the range (0, 1].");
            return KIN_DAMPING_FN_ERR;
          }
        }

        /* damped fixed point */
        N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                     gval, x);
      }
      else
      {
        /* standard fixed point */
        N_VScale(ONE, gval, x);
      }

      return KIN_SUCCESS;
    }

    /* TODO(DJG): In the future, update QRDelete to support removing arbitrary
       columns from the factorization */
    if (new_depth < kin_mem->kin_current_depth)
    {
      /* Remove columns from the left one at a time */
      N_Vector tmp_dg = NULL;
      N_Vector tmp_df = NULL;

      for (int j = 0; j < kin_mem->kin_current_depth - new_depth; j++)
      {
        tmp_dg = kin_mem->kin_dg_aa[0];
        tmp_df = kin_mem->kin_df_aa[0];
        for (long int i = 1; i < kin_mem->kin_current_depth; i++)
        {
          kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
          kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
        }
        kin_mem->kin_dg_aa[kin_mem->kin_current_depth - 1] = tmp_dg;
        kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1] = tmp_df;

        retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                     (int)kin_mem->kin_current_depth);
        if (retval) { return retval; }

        kin_mem->kin_current_depth--;
      }
    }
  }

  /* Solve least squares problem and update solution */
  lAA = kin_mem->kin_current_depth;

  /* Compute Q^T fv */
  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* Compute the damping factor before overwriting gamma below so we can pass
     gamma = Q^T fv (just computed above) to the damping function as it can be
     used to compute the acceleration gain = sqrt(1 - ||Q^T fv||^2/||fv||^2). */
  if (kin_mem->kin_damping_fn)
  {
    retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, gamma, lAA,
                                     kin_mem->kin_user_data,
                                     &(kin_mem->kin_beta_aa));
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping function failed.");
      return KIN_DAMPING_FN_ERR;
    }
    if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping parameter is outside of the range (0, 1].");
      return KIN_DAMPING_FN_ERR;
    }
  }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  /* Solve the upper triangular system R gamma = Q^T fv */
  for (long int i = lAA - 1; i > -1; i--)
  {
    for (long int j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[i];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (long int i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[i];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return KIN_SUCCESS;
}